

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O2

void shuffle(int *a,int n,int n2,int *tmp)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  
  piVar2 = a + n2;
  iVar1 = n2 * 2;
  piVar3 = piVar2;
  for (lVar5 = 0; (int)lVar5 + 1 < n; lVar5 = lVar5 + 2) {
    *(int *)((long)tmp + lVar5 * 2) = *piVar3;
    piVar3 = piVar3 + iVar1;
  }
  piVar3 = a + iVar1;
  for (iVar4 = 2; iVar4 < n; iVar4 = iVar4 + 2) {
    *piVar2 = *piVar3;
    piVar2 = piVar2 + n2;
    piVar3 = piVar3 + iVar1;
  }
  for (lVar5 = 0; (int)lVar5 + 1 < n; lVar5 = lVar5 + 2) {
    *piVar2 = *(int *)((long)tmp + lVar5 * 2);
    piVar2 = piVar2 + n2;
  }
  return;
}

Assistant:

static void
shuffle(int a[], int n, int n2, int tmp[])
{

/* 
int a[];	 array to shuffle					
int n;		 number of elements to shuffle	
int n2;		 second dimension					
int tmp[];	 scratch storage					
*/

int i;
int *p1, *p2, *pt;

	/*
	 * copy odd elements to tmp
	 */
	pt = tmp;
	p1 = &a[n2];
	for (i=1; i < n; i += 2) {
		*pt = *p1;
		pt += 1;
		p1 += (n2+n2);
	}
	/*
	 * compress even elements into first half of A
	 */
	p1 = &a[n2];
	p2 = &a[n2+n2];
	for (i=2; i<n; i += 2) {
		*p1 = *p2;
		p1 += n2;
		p2 += (n2+n2);
	}
	/*
	 * put odd elements into 2nd half
	 */
	pt = tmp;
	for (i = 1; i<n; i += 2) {
		*p1 = *pt;
		p1 += n2;
		pt += 1;
	}
}